

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkCollectStats(Wlc_Ntk_t *p,int (*nObjs) [60])

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  int local_28;
  int local_24;
  int i;
  int n;
  Wlc_Obj_t *pObj;
  int (*nObjs_local) [60];
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_NtkPoNum(p);
  if (iVar1 == 2) {
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      Wlc_NtkMarkCone(p,local_24,1,1,0);
      for (local_28 = 1; iVar1 = Wlc_NtkObjNumMax(p), local_28 < iVar1; local_28 = local_28 + 1) {
        pWVar2 = Wlc_NtkObj(p,local_28);
        if ((*(ushort *)pWVar2 >> 7 & 1) != 0) {
          nObjs[local_24][*(ushort *)pWVar2 & 0x3f] = nObjs[local_24][*(ushort *)pWVar2 & 0x3f] + 1;
        }
      }
    }
    Wlc_NtkCleanMarks(p);
  }
  return;
}

Assistant:

void Wlc_NtkCollectStats( Wlc_Ntk_t * p, int nObjs[2][WLC_OBJ_NUMBER] )
{
    Wlc_Obj_t * pObj;
    int n, i;
    if ( Wlc_NtkPoNum(p) != 2 )
        return;
    for ( n = 0; n < 2; n++ )
    {
        Wlc_NtkMarkCone( p, n, 1, 1, 0 );
        Wlc_NtkForEachObj( p, pObj, i )
            if ( pObj->Mark )
                nObjs[n][pObj->Type]++;
    }
    Wlc_NtkCleanMarks( p );
}